

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

errr cmdq_push_repeat(cmd_code c,wchar_t nrepeats)

{
  wchar_t wVar1;
  undefined1 local_c8 [8];
  command cmd;
  wchar_t nrepeats_local;
  cmd_code c_local;
  
  cmd.arg[3]._36_4_ = nrepeats;
  memset(local_c8,0,0xb0);
  wVar1 = cmd_idx(c);
  if (wVar1 == L'\xffffffff') {
    nrepeats_local = L'\x01';
  }
  else {
    cmd.context = cmd.arg[3]._36_4_;
    local_c8._4_4_ = c;
    nrepeats_local = cmdq_push_copy((command *)local_c8);
  }
  return nrepeats_local;
}

Assistant:

errr cmdq_push_repeat(cmd_code c, int nrepeats)
{
	struct command cmd = {
		.context = CTX_INIT,
		.code = CMD_NULL,
		.nrepeats = 0,
		.is_background_command = false,
		.arg = { { 0 } }
	};

	if (cmd_idx(c) == -1)
		return 1;

	cmd.code = c;
	cmd.nrepeats = nrepeats;

	return cmdq_push_copy(&cmd);
}